

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
merlin::config_index::config_index(config_index *this,variable_set *vars,bool bigendian)

{
  pointer *ppvVar1;
  iterator __position;
  iterator __position_00;
  pointer puVar2;
  vsize *pvVar3;
  long lVar4;
  variable local_40;
  
  (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_bigendian = bigendian;
  puVar2 = (vars->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((vars->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    lVar4 = 0;
    do {
      pvVar3 = vars->m_d;
      local_40.m_label = pvVar3[lVar4];
      __position._M_current =
           (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&this->m_dims,__position,&local_40.m_label);
        puVar2 = (vars->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar3 = vars->m_d;
      }
      else {
        *__position._M_current = local_40.m_label;
        (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_40.m_label = puVar2[lVar4];
      local_40.m_states = pvVar3[lVar4];
      __position_00._M_current =
           (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<merlin::variable,std::allocator<merlin::variable>>::
        _M_realloc_insert<merlin::variable_const&>
                  ((vector<merlin::variable,std::allocator<merlin::variable>> *)&this->m_vars,
                   __position_00,&local_40);
      }
      else {
        (__position_00._M_current)->m_label = local_40.m_label;
        (__position_00._M_current)->m_states = local_40.m_states;
        ppvVar1 = &(this->m_vars).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      lVar4 = lVar4 + 1;
      puVar2 = (vars->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (lVar4 != (long)(vars->m_v).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
  }
  return;
}

Assistant:

~subindex(void) {
		delete[] m_state;
		delete[] m_skipped;
		delete[] m_add;
		delete[] m_subtract;
	}